

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O3

void __thiscall
MemoryLeakOutputStringBuffer::reportMemoryLeak
          (MemoryLeakOutputStringBuffer *this,MemoryLeakDetectorNode *leak)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  size_t sVar6;
  undefined8 uVar7;
  char *s1;
  
  sVar6 = this->total_leaks_;
  if (sVar6 == 0) {
    SimpleStringBuffer::add(&this->outputBuffer_,"Memory leak(s) found.\n");
    sVar6 = this->total_leaks_;
  }
  this->total_leaks_ = sVar6 + 1;
  uVar1 = *(uint *)(leak + 8);
  uVar3 = *(undefined8 *)leak;
  uVar4 = *(undefined8 *)(leak + 0x18);
  uVar2 = *(uint *)(leak + 0x20);
  uVar7 = (**(code **)(**(long **)(leak + 0x28) + 0x28))();
  SimpleStringBuffer::add
            (&this->outputBuffer_,
             "Alloc num (%u) Leak size: %lu Allocated at: %s and line: %d. Type: \"%s\"\n\tMemory: <%p> Content:\n"
             ,(ulong)uVar1,uVar3,uVar4,(ulong)uVar2,uVar7,*(undefined8 *)(leak + 0x10));
  SimpleStringBuffer::addMemoryDump(&this->outputBuffer_,*(void **)(leak + 0x10),*(size_t *)leak);
  s1 = (char *)(**(code **)(**(long **)(leak + 0x28) + 0x28))();
  iVar5 = SimpleString::StrCmp(s1,"malloc");
  if (iVar5 == 0) {
    this->giveWarningOnUsingMalloc_ = true;
  }
  return;
}

Assistant:

void MemoryLeakOutputStringBuffer::reportMemoryLeak(MemoryLeakDetectorNode* leak)
{
    if (total_leaks_ == 0) {
        addMemoryLeakHeader();
    }

    total_leaks_++;
    outputBuffer_.add("Alloc num (%u) Leak size: %lu Allocated at: %s and line: %d. Type: \"%s\"\n\tMemory: <%p> Content:\n",
            leak->number_, (unsigned long) leak->size_, leak->file_, (int) leak->line_, leak->allocator_->alloc_name(), (void*) leak->memory_);
    outputBuffer_.addMemoryDump(leak->memory_, leak->size_);

    if (SimpleString::StrCmp(leak->allocator_->alloc_name(), (const char*) "malloc") == 0)
        giveWarningOnUsingMalloc_ = true;
}